

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fttype1.c
# Opt level: O0

FT_Error FT_Get_PS_Font_Private(FT_Face face,PS_PrivateRec *afont_private)

{
  FT_Driver pFVar1;
  FT_Module_Interface local_40;
  FT_Pointer _tmp_;
  FT_Module module;
  FT_Service_PsInfo service;
  FT_Error error;
  PS_PrivateRec *afont_private_local;
  FT_Face face_local;
  
  if (face == (FT_Face)0x0) {
    face_local._4_4_ = 0x23;
  }
  else if (afont_private == (PS_PrivateRec *)0x0) {
    face_local._4_4_ = 6;
  }
  else {
    pFVar1 = face->driver;
    local_40 = (FT_Module_Interface)0x0;
    if (((pFVar1->root).clazz)->get_interface != (FT_Module_Requester)0x0) {
      local_40 = (*((pFVar1->root).clazz)->get_interface)(&pFVar1->root,"postscript-info");
    }
    if ((local_40 == (FT_Module_Interface)0x0) || (*(long *)((long)local_40 + 0x18) == 0)) {
      service._4_4_ = 6;
    }
    else {
      service._4_4_ = (**(code **)((long)local_40 + 0x18))(face,afont_private);
    }
    face_local._4_4_ = service._4_4_;
  }
  return face_local._4_4_;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Get_PS_Font_Private( FT_Face         face,
                          PS_PrivateRec*  afont_private )
  {
    FT_Error           error;
    FT_Service_PsInfo  service;


    if ( !face )
      return FT_THROW( Invalid_Face_Handle );

    if ( !afont_private )
      return FT_THROW( Invalid_Argument );

    FT_FACE_FIND_SERVICE( face, service, POSTSCRIPT_INFO );

    if ( service && service->ps_get_font_private )
      error = service->ps_get_font_private( face, afont_private );
    else
      error = FT_THROW( Invalid_Argument );

    return error;
  }